

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O1

unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> __thiscall
spvtools::opt::InstrumentPass::StartFunction
          (InstrumentPass *this,uint32_t func_id,Type *return_type,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *param_types)

{
  IRContext *pIVar1;
  TypeManager *this_00;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> _Var2;
  uint32_t ty_id;
  Function *type;
  pointer pOVar3;
  Instruction *this_01;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var4;
  pointer *__ptr;
  SmallVector<unsigned_int,_2UL> *this_02;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_03;
  long lVar5;
  undefined4 in_register_00000034;
  InstrumentPass *pIVar6;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *in_R8;
  Operand *__cur;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  OperandList local_118;
  TypeManager *local_100;
  Type *local_f8;
  InstrumentPass *local_f0;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_e8;
  undefined1 local_e0 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c0;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  pIVar6 = (InstrumentPass *)CONCAT44(in_register_00000034,func_id);
  pIVar1 = (pIVar6->super_Pass).context_;
  local_e8._M_head_impl = (Function *)this;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  this_00 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  local_f8 = (Type *)param_types;
  local_f0 = pIVar6;
  type = GetFunction(pIVar6,(Type *)param_types,in_R8);
  local_b8._24_8_ = local_b8 + 0x10;
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8._8_8_ = 1;
  this_02 = &local_88;
  local_90 = 6;
  local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
  local_88.size_ = 0;
  local_88.small_data_ = (uint *)local_88.buffer;
  local_88.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (this_02,(SmallVector<unsigned_int,_2UL> *)local_b8);
  local_100 = this_00;
  local_e0._16_4_ = analysis::TypeManager::GetId(this_00,&type->super_Type);
  local_e0._24_8_ = local_e0 + 0x10;
  local_e0._0_8_ = &PTR__SmallVector_003e9b28;
  local_c0._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_e0._8_8_ = 1;
  local_60 = 1;
  local_58._0_8_ = &PTR__SmallVector_003e9b28;
  local_58._8_8_ = 0;
  local_58._24_8_ = local_58 + 0x10;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_e0);
  local_118.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = 0x60;
  pOVar3 = (pointer)operator_new(0x60);
  local_118.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar3 + 2;
  local_118.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = pOVar3;
  do {
    pOVar3->type = *(spv_operand_type_t *)
                    &this_02[-1].large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
    (pOVar3->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    (pOVar3->words).size_ = 0;
    (pOVar3->words).small_data_ = (uint *)(pOVar3->words).buffer;
    (pOVar3->words).large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar3->words,this_02);
    pIVar6 = local_f0;
    pOVar3 = pOVar3 + 1;
    this_02 = (SmallVector<unsigned_int,_2UL> *)&this_02[1].size_;
    lVar5 = lVar5 + -0x30;
  } while (lVar5 != 0);
  lVar5 = -0x60;
  this_03 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38;
  local_118.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar3;
  do {
    *(undefined ***)(this_03 + -0x20) = &PTR__SmallVector_003e9b28;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_03 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_03,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_03);
    }
    *(undefined8 *)this_03 = 0;
    this_03 = this_03 + -0x30;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0);
  local_e0._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_c0._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_c0._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  pIVar1 = (pIVar6->super_Pass).context_;
  ty_id = analysis::TypeManager::GetId(local_100,local_f8);
  this_01 = (Instruction *)operator_new(0x70);
  Instruction::Instruction(this_01,pIVar1,OpFunction,ty_id,(uint32_t)return_type,&local_118);
  pIVar1 = (pIVar6->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             this_01);
  _Var4._M_head_impl = (Instruction *)operator_new(0xd0);
  _Var2._M_head_impl = local_e8._M_head_impl;
  *(Instruction **)&(_Var4._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction> =
       this_01;
  *(Instruction **)
   ((long)&(_Var4._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8) =
       (Instruction *)0x0;
  *(Instruction **)
   ((long)&(_Var4._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 0x10) =
       (Instruction *)0x0;
  *(undefined8 *)
   ((long)&(_Var4._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 0x18) = 0;
  *(undefined8 *)&(_Var4._M_head_impl)->unique_id_ = 0;
  *(undefined8 *)
   &((_Var4._M_head_impl)->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> = 0;
  *(undefined ***)&(_Var4._M_head_impl)->opcode_ = &PTR__Instruction_003e9ae0;
  *(undefined4 *)((long)&(_Var4._M_head_impl)->dbg_line_insts_ + 8) = 0;
  *(pointer *)((long)&(_Var4._M_head_impl)->operands_ + 0x10) = (pointer)0x0;
  *(undefined8 *)((long)&(_Var4._M_head_impl)->operands_ + 0x16) = 0;
  *(pointer *)((long)&(_Var4._M_head_impl)->dbg_line_insts_ + 0x10) = (pointer)0x0;
  ((_Var4._M_head_impl)->dbg_scope_).lexical_scope_ = 0;
  ((_Var4._M_head_impl)->dbg_scope_).inlined_at_ = 0;
  _Var4._M_head_impl[1].super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase
       = 0;
  *(Instruction **)((long)(_Var4._M_head_impl + 1) + 8) = (Instruction *)0x0;
  *(Instruction **)((long)(_Var4._M_head_impl + 1) + 0x10) = (Instruction *)0x0;
  *(undefined8 *)((long)(_Var4._M_head_impl + 1) + 0x18) = 0;
  *(IRContext **)((long)(_Var4._M_head_impl + 1) + 0x20) = (IRContext *)0x0;
  *(Op **)&(_Var4._M_head_impl)->unique_id_ = &(_Var4._M_head_impl)->opcode_;
  *(Op **)&((_Var4._M_head_impl)->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> =
       &(_Var4._M_head_impl)->opcode_;
  *(undefined1 *)((long)&(_Var4._M_head_impl)->operands_ + 8) = 1;
  (_Var4._M_head_impl)->context_ = (IRContext *)&PTR__InstructionList_003e9b78;
  *(pointer *)((long)(_Var4._M_head_impl + 1) + 0x58) = (pointer)0x0;
  *(pointer *)((long)(_Var4._M_head_impl + 1) + 0x48) = (pointer)0x0;
  *(undefined8 *)
   &((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
    ((long)(_Var4._M_head_impl + 1) + 0x50))->
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> = 0;
  *(undefined8 *)
   &((OperandList *)((long)(_Var4._M_head_impl + 1) + 0x38))->
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> = 0;
  *(pointer *)((long)(_Var4._M_head_impl + 1) + 0x40) = (pointer)0x0;
  *(undefined8 *)((long)(_Var4._M_head_impl + 1) + 0x28) = 0;
  *(undefined8 *)((long)(_Var4._M_head_impl + 1) + 0x30) = 0;
  ((local_e8._M_head_impl)->def_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = _Var4._M_head_impl;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_118);
  return (__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
            )_Var2._M_head_impl;
}

Assistant:

std::unique_ptr<Function> InstrumentPass::StartFunction(
    uint32_t func_id, const analysis::Type* return_type,
    const std::vector<const analysis::Type*>& param_types) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Function* func_type = GetFunction(return_type, param_types);

  const std::vector<Operand> operands{
      {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
       {uint32_t(spv::FunctionControlMask::MaskNone)}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_mgr->GetId(func_type)}},
  };
  auto func_inst =
      MakeUnique<Instruction>(context(), spv::Op::OpFunction,
                              type_mgr->GetId(return_type), func_id, operands);
  get_def_use_mgr()->AnalyzeInstDefUse(&*func_inst);
  return MakeUnique<Function>(std::move(func_inst));
}